

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_tunnel_linux.c
# Opt level: O0

int os_tunnel_linux_add(os_tunnel *tunnel)

{
  uint uVar1;
  bool bVar2;
  int result;
  os_tunnel *tunnel_local;
  
  bVar2 = false;
  if ((tunnel->_node).list.next != (list_entity *)0x0) {
    bVar2 = (tunnel->_node).list.prev != (list_entity *)0x0;
  }
  if (bVar2) {
    tunnel_local._4_4_ = -1;
  }
  else {
    tunnel_local._4_4_ = _handle_tunnel(tunnel,true);
    if (tunnel_local._4_4_ == 0) {
      (tunnel->_node).key = tunnel;
      avl_insert(&_tunnel_tree,&tunnel->_node);
      uVar1 = if_nametoindex((char *)tunnel);
      tunnel->if_index = uVar1;
    }
    else {
      tunnel->if_index = 0;
    }
  }
  return tunnel_local._4_4_;
}

Assistant:

int
os_tunnel_linux_add(struct os_tunnel *tunnel) {
  int result;

  if (avl_is_node_added(&tunnel->_node)) {
    return -1;
  }

  result = _handle_tunnel(tunnel, true);
  if (!result) {
    tunnel->_node.key = tunnel->p.tunnel_if;
    avl_insert(&_tunnel_tree, &tunnel->_node);

    tunnel->if_index = if_nametoindex(tunnel->p.tunnel_if);
  }
  else {
    tunnel->if_index = 0;
  }
  return result;
}